

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsu.c
# Opt level: O1

UINT8 device_start_vsu(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  uint uVar2;
  DEV_DATA DVar3;
  vsu_state *chip;
  UINT8 UVar4;
  
  DVar3.chipInf = calloc(1,0x210);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    UVar4 = 0xff;
  }
  else {
    uVar1 = cfg->clock;
    *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 0x1f0))->chipInf = uVar1;
    *(uint *)((long)DVar3.chipInf + 500) = uVar1 / 0x78;
    if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (uVar1 / 0x78 < cfg->smplRate)))) {
      *(UINT32 *)((long)DVar3.chipInf + 500) = cfg->smplRate;
    }
    uVar2 = *(uint *)((long)DVar3.chipInf + 500);
    UVar4 = '\0';
    ((DEV_DATA *)((long)DVar3.chipInf + 0x1f8))->chipInf =
         (void *)(CONCAT44(uVar1,uVar2 >> 1) / (ulong)uVar2);
    *(undefined4 *)&((DEV_DATA *)((long)DVar3.chipInf + 0x208))->chipInf = 0;
    *(undefined2 *)((long)DVar3.chipInf + 0x20c) = 0;
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar4;
}

Assistant:

static UINT8 device_start_vsu(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	vsu_state* chip;
	
	chip = (vsu_state*)calloc(1, sizeof(vsu_state));
	if (chip == NULL)
		return 0xFF;
	
	chip->clock = cfg->clock;
	// sample rate according to https://github.com/emu-rs/rustual-boy/blob/master/rustual-boy-core/src/vsu/mod.rs
	// 20 MHz / 480 = 41.667 Hz, VGMs use 5 MHz / 120
	chip->smplrate = chip->clock / 120;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, chip->smplrate, cfg->smplRate);
	
	RC_SET_RATIO(&chip->cycleCntr, cfg->clock, chip->smplrate);
	
	vsu_set_mute_mask(chip, 0x00);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, chip->smplrate, &devDef);
	
	return 0x00;
}